

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

void __thiscall ON_XMLNodePrivate::MoveAfter(ON_XMLNodePrivate *this,ON_XMLNode *other)

{
  ON_XMLNodePrivate *pOVar1;
  ON_XMLNode *pOVar2;
  bool bVar3;
  
  if (this->m_node != other) {
    std::recursive_mutex::lock(&this->m_mutex);
    pOVar2 = PrevSibling(this);
    if (pOVar2 != other) {
      bVar3 = pOVar2 == (ON_XMLNode *)0x0;
      if (bVar3) {
        pOVar2 = this->m_parent;
      }
      (&pOVar2->_private->m_next_sibling)[(ulong)bVar3 * 2] = this->m_next_sibling;
      pOVar1 = other->_private;
      this->m_next_sibling = pOVar1->m_next_sibling;
      pOVar1->m_next_sibling = this->m_node;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    return;
  }
  return;
}

Assistant:

void ON_XMLNodePrivate::MoveAfter(ON_XMLNode& other)
{
  if (&other == &m_node)
    return;

  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  auto* pPrev = PrevSibling();
  if (pPrev == &other)
    return;

  if (nullptr != pPrev)
  {
    pPrev->_private->m_next_sibling = m_next_sibling;
  }
  else
  {
    // 'this' was the head; redirect the parent's first child.
    m_parent->_private->m_first_child = m_next_sibling;
  }

  m_next_sibling = other._private->m_next_sibling;

  other._private->m_next_sibling = &m_node;
}